

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O1

void __thiscall
t_haxe_generator::generate_haxe_doc(t_haxe_generator *this,ostream *out,t_function *tfunction)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  pointer pptVar3;
  stringstream ss;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if ((tfunction->super_t_doc).has_doc_ == true) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(tfunction->super_t_doc).doc_._M_dataplus._M_p,
               (tfunction->super_t_doc).doc_._M_string_length);
    ptVar1 = tfunction->arglist_;
    pptVar3 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar3 !=
        (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        ptVar2 = *pptVar3;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n@param ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(ptVar2->name_)._M_dataplus._M_p,
                   (ptVar2->name_)._M_string_length);
        if ((ptVar2->super_t_doc).has_doc_ == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(ptVar2->super_t_doc).doc_._M_dataplus._M_p,
                     (ptVar2->super_t_doc).doc_._M_string_length);
        }
        pptVar3 = pptVar3 + 1;
      } while (pptVar3 !=
               (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/**\n","");
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218," * ","");
    std::__cxx11::stringbuf::str();
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238," */\n","");
    t_generator::generate_docstring_comment
              ((t_generator *)this,out,&local_1f8,&local_218,&local_1d8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void t_haxe_generator::generate_haxe_doc(ostream& out, t_function* tfunction) {
  if (tfunction->has_doc()) {
    stringstream ss;
    ss << tfunction->get_doc();
    const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
    vector<t_field*>::const_iterator p_iter;
    for (p_iter = fields.begin(); p_iter != fields.end(); ++p_iter) {
      t_field* p = *p_iter;
      ss << "\n@param " << p->get_name();
      if (p->has_doc()) {
        ss << " " << p->get_doc();
      }
    }
    generate_docstring_comment(out, "/**\n", " * ", ss.str(), " */\n");
  }
}